

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderReturnTests.cpp
# Opt level: O0

char * vkt::sr::anon_unknown_0::getReturnModeName(ReturnMode mode)

{
  char *pcStack_10;
  ReturnMode mode_local;
  
  if (mode == RETURNMODE_ALWAYS) {
    pcStack_10 = "always";
  }
  else if (mode == RETURNMODE_NEVER) {
    pcStack_10 = "never";
  }
  else if (mode == RETURNMODE_DYNAMIC) {
    pcStack_10 = "dynamic";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getReturnModeName (ReturnMode mode)
{
	switch (mode)
	{
		case RETURNMODE_ALWAYS:		return "always";
		case RETURNMODE_NEVER:		return "never";
		case RETURNMODE_DYNAMIC:	return "dynamic";
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}